

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::SingleArena_GetSet_Test::~SingleArena_GetSet_Test(SingleArena_GetSet_Test *this)

{
  unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  *this_00;
  
  this_00 = &this[-1].super_SingleArena.super_TestWithParam<bool>.super_Test.gtest_flag_saver_;
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x18);
  return;
}

Assistant:

TEST_P(SingleArena, GetSet) {
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitDefault();
  EXPECT_EQ("", field.Get());
  field.Set("Test short", arena.get());
  EXPECT_EQ("Test short", field.Get());
  field.Set("Test long long long long value", arena.get());
  EXPECT_EQ("Test long long long long value", field.Get());
  field.Set("", arena.get());
  field.Destroy();
}